

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

bool __thiscall
kernel::BlockTreeDB::LoadBlockIndexGuts
          (BlockTreeDB *this,Params *consensusParams,
          function<CBlockIndex_*(const_uint256_&)> *insertBlockIndex,SignalInterrupt *interrupt)

{
  long lVar1;
  uint256 hash;
  string_view source_file;
  string_view source_file_00;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  pointer pCVar5;
  CBlockIndex *pCVar6;
  CDBIterator *in_RDX;
  ConstevalFormatString<1U> in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *pindexNew;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> pcursor;
  CDiskBlockIndex diskindex;
  pair<unsigned_char,_uint256> key;
  pair<unsigned_char,_uint256> *in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  uint256 *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  CDBIterator *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  CBlockIndex *in_stack_fffffffffffffd98;
  CBlockIndex *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdac;
  undefined1 *flag;
  undefined4 uVar7;
  int source_line;
  undefined8 in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  byte bVar8;
  string_view in_stack_fffffffffffffe20;
  undefined1 local_1a0 [40];
  pair<unsigned_char,_uint256> *local_178;
  uint256 *puStack_170;
  CBlockIndex *local_168;
  char *pcStack_160;
  int local_120;
  int local_11c;
  uint local_118;
  uint local_114;
  Level in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  uint32_t local_e0;
  int32_t local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint32_t local_b8;
  uint32_t local_b4;
  uint32_t local_b0;
  char local_79;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            (in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60,
             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0x10f663d);
  ::CDBWrapper::NewIterator((CDBWrapper *)in_stack_fffffffffffffd98);
  flag = local_1a0;
  std::unique_ptr<CDBIterator,std::default_delete<CDBIterator>>::
  unique_ptr<std::default_delete<CDBIterator>,void>
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_stack_fffffffffffffd58
             ,(pointer)0x10f665c);
  pCVar5 = std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
                     ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)
                      in_stack_fffffffffffffd58);
  uVar7 = SUB84(pCVar5,0);
  source_line = (int)((ulong)pCVar5 >> 0x20);
  uint256::uint256((uint256 *)in_stack_fffffffffffffd58);
  std::make_pair<unsigned_char_const&,uint256>
            ((uchar *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  CDBIterator::Seek<std::pair<unsigned_char,uint256>>
            (in_stack_fffffffffffffd88,
             (pair<unsigned_char,_uint256> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  while( true ) {
    std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
              ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)
               in_stack_fffffffffffffd58);
    uVar2 = CDBIterator::Valid((CDBIterator *)in_stack_fffffffffffffd58);
    if (!(bool)uVar2) break;
    uVar3 = util::SignalInterrupt::operator_cast_to_bool
                      ((SignalInterrupt *)in_stack_fffffffffffffd58);
    if ((bool)uVar3) {
      bVar8 = 0;
      goto LAB_010f6b40;
    }
    std::pair<unsigned_char,_uint256>::pair<unsigned_char,_uint256,_true>(in_stack_fffffffffffffd58)
    ;
    std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
              ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)
               in_stack_fffffffffffffd58);
    uVar4 = CDBIterator::GetKey<std::pair<unsigned_char,uint256>>
                      ((CDBIterator *)in_stack_fffffffffffffda0,
                       (pair<unsigned_char,_uint256> *)in_stack_fffffffffffffd98);
    if ((!(bool)uVar4) || (local_79 != 'b')) break;
    CDiskBlockIndex::CDiskBlockIndex((CDiskBlockIndex *)in_stack_fffffffffffffd58);
    std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
              ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)
               in_stack_fffffffffffffd58);
    in_stack_fffffffffffffdac =
         CDBIterator::GetValue<CDiskBlockIndex>
                   (in_RDX,(CDiskBlockIndex *)
                           CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_fffffffffffffdac,
                                                  in_stack_fffffffffffffda8)))));
    if (!(bool)in_stack_fffffffffffffdac) {
      in_stack_fffffffffffffd68 = "LoadBlockIndexGuts";
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      source_file_00._M_str._0_7_ = in_stack_fffffffffffffe18;
      source_file_00._M_len = in_RDI;
      source_file_00._M_str._7_1_ = in_stack_fffffffffffffe1f;
      LogPrintFormatInternal<char[19]>
                (in_stack_fffffffffffffe20,source_file_00,source_line,(LogFlags)flag,
                 in_stack_ffffffffffffff00,in_RSI,
                 (char (*) [19])CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      bVar8 = 0;
      goto LAB_010f6b40;
    }
    CDiskBlockIndex::ConstructBlockHash((CDiskBlockIndex *)in_stack_fffffffffffffd78);
    pCVar6 = std::function<CBlockIndex_*(const_uint256_&)>::operator()
                       ((function<CBlockIndex_*(const_uint256_&)> *)in_stack_fffffffffffffd68,
                        in_stack_fffffffffffffd60);
    in_stack_fffffffffffffda0 = pCVar6;
    in_stack_fffffffffffffd98 =
         std::function<CBlockIndex_*(const_uint256_&)>::operator()
                   ((function<CBlockIndex_*(const_uint256_&)> *)in_stack_fffffffffffffd68,
                    in_stack_fffffffffffffd60);
    pCVar6->pprev = in_stack_fffffffffffffd98;
    pCVar6->nHeight = local_120;
    pCVar6->nFile = local_11c;
    pCVar6->nDataPos = local_118;
    pCVar6->nUndoPos = local_114;
    pCVar6->nVersion = local_dc;
    *(undefined8 *)((pCVar6->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_c8;
    *(undefined8 *)((pCVar6->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x18) =
         uStack_c0;
    *(undefined8 *)(pCVar6->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems = local_d8;
    *(undefined8 *)((pCVar6->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 8) = uStack_d0;
    pCVar6->nTime = local_b8;
    pCVar6->nBits = local_b4;
    pCVar6->nNonce = local_b0;
    pCVar6->nStatus = local_e0;
    pCVar6->nTx = in_stack_ffffffffffffff10;
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffffd68);
    hash.super_base_blob<256U>.m_data._M_elems[8] = (char)uVar7;
    hash.super_base_blob<256U>.m_data._M_elems[9] = (char)((uint)uVar7 >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[10] = (char)((uint)uVar7 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0xb] = (char)((uint)uVar7 >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ = flag;
    hash.super_base_blob<256U>.m_data._M_elems[0xc] = (char)source_line;
    hash.super_base_blob<256U>.m_data._M_elems[0xd] = (char)((uint)source_line >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[0xe] = (char)((uint)source_line >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0xf] = (char)((uint)source_line >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0x10] = (char)in_stack_fffffffffffffdd0;
    hash.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)in_stack_fffffffffffffdd0 >> 8)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[0x12] =
         (char)((ulong)in_stack_fffffffffffffdd0 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0x13] =
         (char)((ulong)in_stack_fffffffffffffdd0 >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0x14] =
         (char)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
    hash.super_base_blob<256U>.m_data._M_elems[0x15] =
         (char)((ulong)in_stack_fffffffffffffdd0 >> 0x28);
    hash.super_base_blob<256U>.m_data._M_elems[0x16] =
         (char)((ulong)in_stack_fffffffffffffdd0 >> 0x30);
    hash.super_base_blob<256U>.m_data._M_elems[0x17] =
         (char)((ulong)in_stack_fffffffffffffdd0 >> 0x38);
    hash.super_base_blob<256U>.m_data._M_elems[0x18] = (char)in_stack_fffffffffffffdd8;
    hash.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)in_stack_fffffffffffffdd8 >> 8)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         (char)((ulong)in_stack_fffffffffffffdd8 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         (char)((ulong)in_stack_fffffffffffffdd8 >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         (char)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         (char)((ulong)in_stack_fffffffffffffdd8 >> 0x28);
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         (char)((ulong)in_stack_fffffffffffffdd8 >> 0x30);
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         (char)((ulong)in_stack_fffffffffffffdd8 >> 0x38);
    in_stack_fffffffffffffd58 = local_178;
    in_stack_fffffffffffffd60 = puStack_170;
    in_stack_fffffffffffffd68 = (char *)local_168;
    in_stack_fffffffffffffd70 = pcStack_160;
    uVar2 = CheckProofOfWork(hash,(uint)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                             (Params *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80)
                            );
    if (!(bool)uVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      uVar7 = (undefined4)((ulong)in_stack_fffffffffffffd58 >> 0x20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      CBlockIndex::ToString_abi_cxx11_((CBlockIndex *)CONCAT17(uVar2,in_stack_fffffffffffffd90));
      in_stack_fffffffffffffd68 = "LoadBlockIndexGuts";
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(uVar7,4);
      source_file._M_str._0_7_ = in_stack_fffffffffffffe18;
      source_file._M_len = in_RDI;
      source_file._M_str._7_1_ = in_stack_fffffffffffffe1f;
      LogPrintFormatInternal<char[19],std::__cxx11::string>
                (in_stack_fffffffffffffe20,source_file,source_line,(LogFlags)flag,
                 in_stack_ffffffffffffff00,(ConstevalFormatString<2U>)in_RSI.fmt,
                 (char (*) [19])CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff18);
      std::__cxx11::string::~string(this_00);
      bVar8 = 0;
      goto LAB_010f6b40;
    }
    std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
              ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)
               in_stack_fffffffffffffd58);
    CDBIterator::Next((CDBIterator *)in_stack_fffffffffffffd58);
  }
  bVar8 = 1;
LAB_010f6b40:
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_stack_fffffffffffffd68
            );
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar8 & 1);
}

Assistant:

bool BlockTreeDB::LoadBlockIndexGuts(const Consensus::Params& consensusParams, std::function<CBlockIndex*(const uint256&)> insertBlockIndex, const util::SignalInterrupt& interrupt)
{
    AssertLockHeld(::cs_main);
    std::unique_ptr<CDBIterator> pcursor(NewIterator());
    pcursor->Seek(std::make_pair(DB_BLOCK_INDEX, uint256()));

    // Load m_block_index
    while (pcursor->Valid()) {
        if (interrupt) return false;
        std::pair<uint8_t, uint256> key;
        if (pcursor->GetKey(key) && key.first == DB_BLOCK_INDEX) {
            CDiskBlockIndex diskindex;
            if (pcursor->GetValue(diskindex)) {
                // Construct block index object
                CBlockIndex* pindexNew = insertBlockIndex(diskindex.ConstructBlockHash());
                pindexNew->pprev          = insertBlockIndex(diskindex.hashPrev);
                pindexNew->nHeight        = diskindex.nHeight;
                pindexNew->nFile          = diskindex.nFile;
                pindexNew->nDataPos       = diskindex.nDataPos;
                pindexNew->nUndoPos       = diskindex.nUndoPos;
                pindexNew->nVersion       = diskindex.nVersion;
                pindexNew->hashMerkleRoot = diskindex.hashMerkleRoot;
                pindexNew->nTime          = diskindex.nTime;
                pindexNew->nBits          = diskindex.nBits;
                pindexNew->nNonce         = diskindex.nNonce;
                pindexNew->nStatus        = diskindex.nStatus;
                pindexNew->nTx            = diskindex.nTx;

                if (!CheckProofOfWork(pindexNew->GetBlockHash(), pindexNew->nBits, consensusParams)) {
                    LogError("%s: CheckProofOfWork failed: %s\n", __func__, pindexNew->ToString());
                    return false;
                }

                pcursor->Next();
            } else {
                LogError("%s: failed to read value\n", __func__);
                return false;
            }
        } else {
            break;
        }
    }

    return true;
}